

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O0

int __thiscall glslang::TPpContext::tZeroInput::scan(tZeroInput *this,TPpToken *ppToken)

{
  TPpToken *ppToken_local;
  tZeroInput *this_local;
  
  if (((this->super_tInput).done & 1U) == 0) {
    ppToken->name[0] = '0';
    ppToken->name[1] = '\0';
    (ppToken->field_3).ival = 0;
    ppToken->space = false;
    (this->super_tInput).done = true;
    this_local._4_4_ = 0x98;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int TPpContext::tZeroInput::scan(TPpToken* ppToken)
{
    if (done)
        return EndOfInput;

    ppToken->name[0] = '0';
    ppToken->name[1] = 0;
    ppToken->ival = 0;
    ppToken->space = false;
    done = true;

    return PpAtomConstInt;
}